

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLLoader.cpp
# Opt level: O2

int Load_ARB_shader_objects(void)

{
  _func_GLhandleARB *p_Var1;
  _func_GLhandleARB_GLenum *p_Var2;
  _func_void_GLhandleARB *p_Var3;
  _func_void_GLhandleARB_GLhandleARB *p_Var4;
  _func_void_GLhandleARB_GLuint_GLsizei_GLsizei_ptr_GLint_ptr_GLenum_ptr_GLcharARB_ptr *p_Var5;
  _func_void_GLhandleARB_GLsizei_GLsizei_ptr_GLhandleARB_ptr *p_Var6;
  _func_GLhandleARB_GLenum *p_Var7;
  _func_void_GLhandleARB_GLsizei_GLsizei_ptr_GLcharARB_ptr *p_Var8;
  _func_void_GLhandleARB_GLenum_GLfloat_ptr *p_Var9;
  _func_void_GLhandleARB_GLenum_GLint_ptr *p_Var10;
  _func_void_GLhandleARB_GLsizei_GLsizei_ptr_GLcharARB_ptr *p_Var11;
  _func_GLint_GLhandleARB_GLcharARB_ptr *p_Var12;
  _func_void_GLhandleARB_GLint_GLfloat_ptr *p_Var13;
  _func_void_GLhandleARB_GLint_GLint_ptr *p_Var14;
  _func_void_GLhandleARB *p_Var15;
  _func_void_GLhandleARB_GLsizei_GLcharARB_ptr_ptr_GLint_ptr *p_Var16;
  _func_void_GLint_GLfloat *p_Var17;
  _func_void_GLint_GLsizei_GLfloat_ptr *p_Var18;
  _func_void_GLint_GLint *p_Var19;
  _func_void_GLint_GLsizei_GLint_ptr *p_Var20;
  _func_void_GLint_GLfloat_GLfloat *p_Var21;
  _func_void_GLint_GLsizei_GLfloat_ptr *p_Var22;
  _func_void_GLint_GLint_GLint *p_Var23;
  _func_void_GLint_GLsizei_GLint_ptr *p_Var24;
  _func_void_GLint_GLfloat_GLfloat_GLfloat *p_Var25;
  _func_void_GLint_GLsizei_GLfloat_ptr *p_Var26;
  _func_void_GLint_GLint_GLint_GLint *p_Var27;
  _func_void_GLint_GLsizei_GLint_ptr *p_Var28;
  _func_void_GLint_GLfloat_GLfloat_GLfloat_GLfloat *p_Var29;
  _func_void_GLint_GLsizei_GLfloat_ptr *p_Var30;
  _func_void_GLint_GLint_GLint_GLint_GLint *p_Var31;
  _func_void_GLint_GLsizei_GLint_ptr *p_Var32;
  _func_void_GLint_GLsizei_GLboolean_GLfloat_ptr *p_Var33;
  _func_void_GLint_GLsizei_GLboolean_GLfloat_ptr *p_Var34;
  _func_void_GLint_GLsizei_GLboolean_GLfloat_ptr *p_Var35;
  _func_void_GLhandleARB *p_Var36;
  uint uVar37;
  int iVar38;
  uint uVar39;
  bool bVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  int local_188;
  int iStack_184;
  int iStack_180;
  int iStack_17c;
  int local_178;
  int iStack_174;
  int iStack_170;
  int iStack_16c;
  int local_168;
  int iStack_164;
  int iStack_160;
  int iStack_15c;
  int local_158;
  int iStack_154;
  int iStack_150;
  int iStack_14c;
  int local_148;
  int iStack_144;
  int iStack_140;
  int iStack_13c;
  int local_138;
  int iStack_134;
  int iStack_130;
  int iStack_12c;
  int local_128;
  int iStack_124;
  int iStack_120;
  int iStack_11c;
  int local_118;
  int iStack_114;
  int iStack_110;
  int iStack_10c;
  int local_108;
  int iStack_104;
  int iStack_100;
  int iStack_fc;
  int local_f8;
  int iStack_f4;
  int iStack_f0;
  int iStack_ec;
  int local_e8;
  int iStack_e4;
  int iStack_e0;
  int iStack_dc;
  int local_d8;
  int iStack_d4;
  int iStack_d0;
  int iStack_cc;
  int local_c8;
  int iStack_c4;
  int iStack_c0;
  int iStack_bc;
  int local_b8;
  int iStack_b4;
  int iStack_b0;
  int iStack_ac;
  int local_a8;
  int iStack_a4;
  int iStack_a0;
  int iStack_9c;
  int local_98;
  int iStack_94;
  int iStack_90;
  int iStack_8c;
  int local_88;
  int iStack_84;
  int iStack_80;
  int iStack_7c;
  int local_78;
  int iStack_74;
  int iStack_70;
  int iStack_6c;
  
  sf_ptrc_glAttachObjectARB =
       (_func_void_GLhandleARB_GLhandleARB *)sf::Context::getFunction("glAttachObjectARB");
  bVar40 = sf_ptrc_glAttachObjectARB == (_func_void_GLhandleARB_GLhandleARB *)0x0;
  sf_ptrc_glCompileShaderARB =
       (_func_void_GLhandleARB *)sf::Context::getFunction("glCompileShaderARB");
  uVar37 = bVar40 + 1;
  if (sf_ptrc_glCompileShaderARB != (_func_void_GLhandleARB *)0x0) {
    uVar37 = (uint)bVar40;
  }
  uVar39 = uVar37;
  p_Var1 = (_func_GLhandleARB *)sf::Context::getFunction("glCreateProgramObjectARB");
  sf_ptrc_glCreateProgramObjectARB = p_Var1;
  p_Var2 = (_func_GLhandleARB_GLenum *)sf::Context::getFunction("glCreateShaderObjectARB");
  sf_ptrc_glCreateShaderObjectARB = p_Var2;
  p_Var3 = (_func_void_GLhandleARB *)sf::Context::getFunction("glDeleteObjectARB");
  sf_ptrc_glDeleteObjectARB = p_Var3;
  p_Var4 = (_func_void_GLhandleARB_GLhandleARB *)sf::Context::getFunction("glDetachObjectARB");
  sf_ptrc_glDetachObjectARB = p_Var4;
  p_Var5 = (_func_void_GLhandleARB_GLuint_GLsizei_GLsizei_ptr_GLint_ptr_GLenum_ptr_GLcharARB_ptr *)
           sf::Context::getFunction("glGetActiveUniformARB");
  sf_ptrc_glGetActiveUniformARB = p_Var5;
  p_Var6 = (_func_void_GLhandleARB_GLsizei_GLsizei_ptr_GLhandleARB_ptr *)
           sf::Context::getFunction("glGetAttachedObjectsARB");
  sf_ptrc_glGetAttachedObjectsARB = p_Var6;
  p_Var7 = (_func_GLhandleARB_GLenum *)sf::Context::getFunction("glGetHandleARB");
  sf_ptrc_glGetHandleARB = p_Var7;
  p_Var8 = (_func_void_GLhandleARB_GLsizei_GLsizei_ptr_GLcharARB_ptr *)
           sf::Context::getFunction("glGetInfoLogARB");
  sf_ptrc_glGetInfoLogARB = p_Var8;
  p_Var9 = (_func_void_GLhandleARB_GLenum_GLfloat_ptr *)
           sf::Context::getFunction("glGetObjectParameterfvARB");
  sf_ptrc_glGetObjectParameterfvARB = p_Var9;
  p_Var10 = (_func_void_GLhandleARB_GLenum_GLint_ptr *)
            sf::Context::getFunction("glGetObjectParameterivARB");
  sf_ptrc_glGetObjectParameterivARB = p_Var10;
  p_Var11 = (_func_void_GLhandleARB_GLsizei_GLsizei_ptr_GLcharARB_ptr *)
            sf::Context::getFunction("glGetShaderSourceARB");
  sf_ptrc_glGetShaderSourceARB = p_Var11;
  p_Var12 = (_func_GLint_GLhandleARB_GLcharARB_ptr *)
            sf::Context::getFunction("glGetUniformLocationARB");
  sf_ptrc_glGetUniformLocationARB = p_Var12;
  p_Var13 = (_func_void_GLhandleARB_GLint_GLfloat_ptr *)
            sf::Context::getFunction("glGetUniformfvARB");
  sf_ptrc_glGetUniformfvARB = p_Var13;
  p_Var14 = (_func_void_GLhandleARB_GLint_GLint_ptr *)sf::Context::getFunction("glGetUniformivARB");
  sf_ptrc_glGetUniformivARB = p_Var14;
  p_Var15 = (_func_void_GLhandleARB *)sf::Context::getFunction("glLinkProgramARB");
  sf_ptrc_glLinkProgramARB = p_Var15;
  p_Var16 = (_func_void_GLhandleARB_GLsizei_GLcharARB_ptr_ptr_GLint_ptr *)
            sf::Context::getFunction("glShaderSourceARB");
  sf_ptrc_glShaderSourceARB = p_Var16;
  p_Var17 = (_func_void_GLint_GLfloat *)sf::Context::getFunction("glUniform1fARB");
  sf_ptrc_glUniform1fARB = p_Var17;
  p_Var18 = (_func_void_GLint_GLsizei_GLfloat_ptr *)sf::Context::getFunction("glUniform1fvARB");
  sf_ptrc_glUniform1fvARB = p_Var18;
  p_Var19 = (_func_void_GLint_GLint *)sf::Context::getFunction("glUniform1iARB");
  sf_ptrc_glUniform1iARB = p_Var19;
  p_Var20 = (_func_void_GLint_GLsizei_GLint_ptr *)sf::Context::getFunction("glUniform1ivARB");
  sf_ptrc_glUniform1ivARB = p_Var20;
  p_Var21 = (_func_void_GLint_GLfloat_GLfloat *)sf::Context::getFunction("glUniform2fARB");
  sf_ptrc_glUniform2fARB = p_Var21;
  p_Var22 = (_func_void_GLint_GLsizei_GLfloat_ptr *)sf::Context::getFunction("glUniform2fvARB");
  sf_ptrc_glUniform2fvARB = p_Var22;
  p_Var23 = (_func_void_GLint_GLint_GLint *)sf::Context::getFunction("glUniform2iARB");
  sf_ptrc_glUniform2iARB = p_Var23;
  p_Var24 = (_func_void_GLint_GLsizei_GLint_ptr *)sf::Context::getFunction("glUniform2ivARB");
  sf_ptrc_glUniform2ivARB = p_Var24;
  p_Var25 = (_func_void_GLint_GLfloat_GLfloat_GLfloat *)sf::Context::getFunction("glUniform3fARB");
  sf_ptrc_glUniform3fARB = p_Var25;
  p_Var26 = (_func_void_GLint_GLsizei_GLfloat_ptr *)sf::Context::getFunction("glUniform3fvARB");
  sf_ptrc_glUniform3fvARB = p_Var26;
  p_Var27 = (_func_void_GLint_GLint_GLint_GLint *)sf::Context::getFunction("glUniform3iARB");
  sf_ptrc_glUniform3iARB = p_Var27;
  p_Var28 = (_func_void_GLint_GLsizei_GLint_ptr *)sf::Context::getFunction("glUniform3ivARB");
  sf_ptrc_glUniform3ivARB = p_Var28;
  p_Var29 = (_func_void_GLint_GLfloat_GLfloat_GLfloat_GLfloat *)
            sf::Context::getFunction("glUniform4fARB");
  sf_ptrc_glUniform4fARB = p_Var29;
  p_Var30 = (_func_void_GLint_GLsizei_GLfloat_ptr *)sf::Context::getFunction("glUniform4fvARB");
  sf_ptrc_glUniform4fvARB = p_Var30;
  p_Var31 = (_func_void_GLint_GLint_GLint_GLint_GLint *)sf::Context::getFunction("glUniform4iARB");
  sf_ptrc_glUniform4iARB = p_Var31;
  p_Var32 = (_func_void_GLint_GLsizei_GLint_ptr *)sf::Context::getFunction("glUniform4ivARB");
  sf_ptrc_glUniform4ivARB = p_Var32;
  p_Var33 = (_func_void_GLint_GLsizei_GLboolean_GLfloat_ptr *)
            sf::Context::getFunction("glUniformMatrix2fvARB");
  sf_ptrc_glUniformMatrix2fvARB = p_Var33;
  p_Var34 = (_func_void_GLint_GLsizei_GLboolean_GLfloat_ptr *)
            sf::Context::getFunction("glUniformMatrix3fvARB");
  sf_ptrc_glUniformMatrix3fvARB = p_Var34;
  p_Var35 = (_func_void_GLint_GLsizei_GLboolean_GLfloat_ptr *)
            sf::Context::getFunction("glUniformMatrix4fvARB");
  sf_ptrc_glUniformMatrix4fvARB = p_Var35;
  p_Var36 = (_func_void_GLhandleARB *)sf::Context::getFunction("glUseProgramObjectARB");
  sf_ptrc_glUseProgramObjectARB = p_Var36;
  sf_ptrc_glValidateProgramARB =
       (_func_void_GLhandleARB *)sf::Context::getFunction("glValidateProgramARB");
  local_188 = (int)p_Var1;
  iStack_184 = (int)((ulong)p_Var1 >> 0x20);
  iStack_180 = (int)p_Var2;
  iStack_17c = (int)((ulong)p_Var2 >> 0x20);
  auVar55._0_4_ = -(uint)(local_188 == 0);
  auVar55._4_4_ = -(uint)(iStack_184 == 0);
  auVar55._8_4_ = -(uint)(iStack_180 == 0);
  auVar55._12_4_ = -(uint)(iStack_17c == 0);
  auVar41._4_4_ = auVar55._0_4_;
  auVar41._0_4_ = auVar55._4_4_;
  auVar41._8_4_ = auVar55._12_4_;
  auVar41._12_4_ = auVar55._8_4_;
  local_a8 = (int)p_Var3;
  iStack_a4 = (int)((ulong)p_Var3 >> 0x20);
  iStack_a0 = (int)p_Var4;
  iStack_9c = (int)((ulong)p_Var4 >> 0x20);
  auVar49._0_4_ = -(uint)(local_a8 == 0);
  auVar49._4_4_ = -(uint)(iStack_a4 == 0);
  auVar49._8_4_ = -(uint)(iStack_a0 == 0);
  auVar49._12_4_ = -(uint)(iStack_9c == 0);
  auVar62._4_4_ = auVar49._0_4_;
  auVar62._0_4_ = auVar49._4_4_;
  auVar62._8_4_ = auVar49._12_4_;
  auVar62._12_4_ = auVar49._8_4_;
  auVar41 = packssdw(auVar41 & auVar55,auVar62 & auVar49);
  local_98 = (int)p_Var5;
  iStack_94 = (int)((ulong)p_Var5 >> 0x20);
  iStack_90 = (int)p_Var6;
  iStack_8c = (int)((ulong)p_Var6 >> 0x20);
  auVar50._0_4_ = -(uint)(local_98 == 0);
  auVar50._4_4_ = -(uint)(iStack_94 == 0);
  auVar50._8_4_ = -(uint)(iStack_90 == 0);
  auVar50._12_4_ = -(uint)(iStack_8c == 0);
  auVar42._4_4_ = auVar50._0_4_;
  auVar42._0_4_ = auVar50._4_4_;
  auVar42._8_4_ = auVar50._12_4_;
  auVar42._12_4_ = auVar50._8_4_;
  local_c8 = (int)p_Var7;
  iStack_c4 = (int)((ulong)p_Var7 >> 0x20);
  iStack_c0 = (int)p_Var8;
  iStack_bc = (int)((ulong)p_Var8 >> 0x20);
  auVar64._0_4_ = -(uint)(local_c8 == 0);
  auVar64._4_4_ = -(uint)(iStack_c4 == 0);
  auVar64._8_4_ = -(uint)(iStack_c0 == 0);
  auVar64._12_4_ = -(uint)(iStack_bc == 0);
  auVar51._4_4_ = auVar64._0_4_;
  auVar51._0_4_ = auVar64._4_4_;
  auVar51._8_4_ = auVar64._12_4_;
  auVar51._12_4_ = auVar64._8_4_;
  auVar43 = packssdw(auVar42 & auVar50,auVar51 & auVar64);
  auVar41 = packssdw(auVar41,auVar43);
  local_b8 = (int)p_Var9;
  iStack_b4 = (int)((ulong)p_Var9 >> 0x20);
  iStack_b0 = (int)p_Var10;
  iStack_ac = (int)((ulong)p_Var10 >> 0x20);
  auVar52._0_4_ = -(uint)(local_b8 == 0);
  auVar52._4_4_ = -(uint)(iStack_b4 == 0);
  auVar52._8_4_ = -(uint)(iStack_b0 == 0);
  auVar52._12_4_ = -(uint)(iStack_ac == 0);
  auVar44._4_4_ = auVar52._0_4_;
  auVar44._0_4_ = auVar52._4_4_;
  auVar44._8_4_ = auVar52._12_4_;
  auVar44._12_4_ = auVar52._8_4_;
  local_e8 = (int)p_Var11;
  iStack_e4 = (int)((ulong)p_Var11 >> 0x20);
  iStack_e0 = (int)p_Var12;
  iStack_dc = (int)((ulong)p_Var12 >> 0x20);
  auVar65._0_4_ = -(uint)(local_e8 == 0);
  auVar65._4_4_ = -(uint)(iStack_e4 == 0);
  auVar65._8_4_ = -(uint)(iStack_e0 == 0);
  auVar65._12_4_ = -(uint)(iStack_dc == 0);
  auVar53._4_4_ = auVar65._0_4_;
  auVar53._0_4_ = auVar65._4_4_;
  auVar53._8_4_ = auVar65._12_4_;
  auVar53._12_4_ = auVar65._8_4_;
  auVar43 = packssdw(auVar44 & auVar52,auVar53 & auVar65);
  local_d8 = (int)p_Var13;
  iStack_d4 = (int)((ulong)p_Var13 >> 0x20);
  iStack_d0 = (int)p_Var14;
  iStack_cc = (int)((ulong)p_Var14 >> 0x20);
  auVar66._0_4_ = -(uint)(local_d8 == 0);
  auVar66._4_4_ = -(uint)(iStack_d4 == 0);
  auVar66._8_4_ = -(uint)(iStack_d0 == 0);
  auVar66._12_4_ = -(uint)(iStack_cc == 0);
  auVar54._4_4_ = auVar66._0_4_;
  auVar54._0_4_ = auVar66._4_4_;
  auVar54._8_4_ = auVar66._12_4_;
  auVar54._12_4_ = auVar66._8_4_;
  local_108 = (int)p_Var15;
  iStack_104 = (int)((ulong)p_Var15 >> 0x20);
  iStack_100 = (int)p_Var16;
  iStack_fc = (int)((ulong)p_Var16 >> 0x20);
  auVar72._0_4_ = -(uint)(local_108 == 0);
  auVar72._4_4_ = -(uint)(iStack_104 == 0);
  auVar72._8_4_ = -(uint)(iStack_100 == 0);
  auVar72._12_4_ = -(uint)(iStack_fc == 0);
  auVar67._4_4_ = auVar72._0_4_;
  auVar67._0_4_ = auVar72._4_4_;
  auVar67._8_4_ = auVar72._12_4_;
  auVar67._12_4_ = auVar72._8_4_;
  auVar55 = packssdw(auVar54 & auVar66,auVar67 & auVar72);
  auVar43 = packssdw(auVar43,auVar55);
  auVar41 = packsswb(auVar41,auVar43);
  local_f8 = (int)p_Var17;
  iStack_f4 = (int)((ulong)p_Var17 >> 0x20);
  iStack_f0 = (int)p_Var18;
  iStack_ec = (int)((ulong)p_Var18 >> 0x20);
  auVar45._0_4_ = -(uint)(local_f8 == 0);
  auVar45._4_4_ = -(uint)(iStack_f4 == 0);
  auVar45._8_4_ = -(uint)(iStack_f0 == 0);
  auVar45._12_4_ = -(uint)(iStack_ec == 0);
  auVar43._4_4_ = auVar45._0_4_;
  auVar43._0_4_ = auVar45._4_4_;
  auVar43._8_4_ = auVar45._12_4_;
  auVar43._12_4_ = auVar45._8_4_;
  local_138 = (int)p_Var19;
  iStack_134 = (int)((ulong)p_Var19 >> 0x20);
  iStack_130 = (int)p_Var20;
  iStack_12c = (int)((ulong)p_Var20 >> 0x20);
  auVar56._0_4_ = -(uint)(local_138 == 0);
  auVar56._4_4_ = -(uint)(iStack_134 == 0);
  auVar56._8_4_ = -(uint)(iStack_130 == 0);
  auVar56._12_4_ = -(uint)(iStack_12c == 0);
  auVar46._4_4_ = auVar56._0_4_;
  auVar46._0_4_ = auVar56._4_4_;
  auVar46._8_4_ = auVar56._12_4_;
  auVar46._12_4_ = auVar56._8_4_;
  auVar43 = packssdw(auVar43 & auVar45,auVar46 & auVar56);
  local_118 = (int)p_Var21;
  iStack_114 = (int)((ulong)p_Var21 >> 0x20);
  iStack_110 = (int)p_Var22;
  iStack_10c = (int)((ulong)p_Var22 >> 0x20);
  auVar57._0_4_ = -(uint)(local_118 == 0);
  auVar57._4_4_ = -(uint)(iStack_114 == 0);
  auVar57._8_4_ = -(uint)(iStack_110 == 0);
  auVar57._12_4_ = -(uint)(iStack_10c == 0);
  auVar47._4_4_ = auVar57._0_4_;
  auVar47._0_4_ = auVar57._4_4_;
  auVar47._8_4_ = auVar57._12_4_;
  auVar47._12_4_ = auVar57._8_4_;
  local_178 = (int)p_Var23;
  iStack_174 = (int)((ulong)p_Var23 >> 0x20);
  iStack_170 = (int)p_Var24;
  iStack_16c = (int)((ulong)p_Var24 >> 0x20);
  auVar68._0_4_ = -(uint)(local_178 == 0);
  auVar68._4_4_ = -(uint)(iStack_174 == 0);
  auVar68._8_4_ = -(uint)(iStack_170 == 0);
  auVar68._12_4_ = -(uint)(iStack_16c == 0);
  auVar58._4_4_ = auVar68._0_4_;
  auVar58._0_4_ = auVar68._4_4_;
  auVar58._8_4_ = auVar68._12_4_;
  auVar58._12_4_ = auVar68._8_4_;
  auVar55 = packssdw(auVar47 & auVar57,auVar58 & auVar68);
  auVar43 = packssdw(auVar43,auVar55);
  local_158 = (int)p_Var25;
  iStack_154 = (int)((ulong)p_Var25 >> 0x20);
  iStack_150 = (int)p_Var26;
  iStack_14c = (int)((ulong)p_Var26 >> 0x20);
  auVar59._0_4_ = -(uint)(local_158 == 0);
  auVar59._4_4_ = -(uint)(iStack_154 == 0);
  auVar59._8_4_ = -(uint)(iStack_150 == 0);
  auVar59._12_4_ = -(uint)(iStack_14c == 0);
  auVar48._4_4_ = auVar59._0_4_;
  auVar48._0_4_ = auVar59._4_4_;
  auVar48._8_4_ = auVar59._12_4_;
  auVar48._12_4_ = auVar59._8_4_;
  local_168 = (int)p_Var27;
  iStack_164 = (int)((ulong)p_Var27 >> 0x20);
  iStack_160 = (int)p_Var28;
  iStack_15c = (int)((ulong)p_Var28 >> 0x20);
  auVar69._0_4_ = -(uint)(local_168 == 0);
  auVar69._4_4_ = -(uint)(iStack_164 == 0);
  auVar69._8_4_ = -(uint)(iStack_160 == 0);
  auVar69._12_4_ = -(uint)(iStack_15c == 0);
  auVar60._4_4_ = auVar69._0_4_;
  auVar60._0_4_ = auVar69._4_4_;
  auVar60._8_4_ = auVar69._12_4_;
  auVar60._12_4_ = auVar69._8_4_;
  auVar55 = packssdw(auVar48 & auVar59,auVar60 & auVar69);
  local_148 = (int)p_Var29;
  iStack_144 = (int)((ulong)p_Var29 >> 0x20);
  iStack_140 = (int)p_Var30;
  iStack_13c = (int)((ulong)p_Var30 >> 0x20);
  auVar70._0_4_ = -(uint)(local_148 == 0);
  auVar70._4_4_ = -(uint)(iStack_144 == 0);
  auVar70._8_4_ = -(uint)(iStack_140 == 0);
  auVar70._12_4_ = -(uint)(iStack_13c == 0);
  auVar61._4_4_ = auVar70._0_4_;
  auVar61._0_4_ = auVar70._4_4_;
  auVar61._8_4_ = auVar70._12_4_;
  auVar61._12_4_ = auVar70._8_4_;
  local_128 = (int)p_Var31;
  iStack_124 = (int)((ulong)p_Var31 >> 0x20);
  iStack_120 = (int)p_Var32;
  iStack_11c = (int)((ulong)p_Var32 >> 0x20);
  auVar73._0_4_ = -(uint)(local_128 == 0);
  auVar73._4_4_ = -(uint)(iStack_124 == 0);
  auVar73._8_4_ = -(uint)(iStack_120 == 0);
  auVar73._12_4_ = -(uint)(iStack_11c == 0);
  auVar71._4_4_ = auVar73._0_4_;
  auVar71._0_4_ = auVar73._4_4_;
  auVar71._8_4_ = auVar73._12_4_;
  auVar71._12_4_ = auVar73._8_4_;
  auVar62 = packssdw(auVar61 & auVar70,auVar71 & auVar73);
  auVar55 = packssdw(auVar55,auVar62);
  auVar43 = packsswb(auVar43,auVar55);
  local_88 = (int)p_Var33;
  iStack_84 = (int)((ulong)p_Var33 >> 0x20);
  iStack_80 = (int)p_Var34;
  iStack_7c = (int)((ulong)p_Var34 >> 0x20);
  local_78 = (int)p_Var35;
  iStack_74 = (int)((ulong)p_Var35 >> 0x20);
  iStack_70 = (int)p_Var36;
  iStack_6c = (int)((ulong)p_Var36 >> 0x20);
  auVar63._0_4_ = -(uint)(iStack_84 == 0 && local_88 == 0);
  auVar63._4_4_ = -(uint)(iStack_80 == 0 && iStack_7c == 0);
  auVar63._8_4_ = -(uint)(iStack_74 == 0 && local_78 == 0);
  auVar63._12_4_ = -(uint)(iStack_70 == 0 && iStack_6c == 0);
  iVar38 = movmskps(uVar39,auVar63);
  uVar39 = CONCAT22((ushort)(SUB161(auVar43 >> 7,0) & 1) |
                    (ushort)(SUB161(auVar43 >> 0xf,0) & 1) << 1 |
                    (ushort)(SUB161(auVar43 >> 0x17,0) & 1) << 2 |
                    (ushort)(SUB161(auVar43 >> 0x1f,0) & 1) << 3 |
                    (ushort)(SUB161(auVar43 >> 0x27,0) & 1) << 4 |
                    (ushort)(SUB161(auVar43 >> 0x2f,0) & 1) << 5 |
                    (ushort)(SUB161(auVar43 >> 0x37,0) & 1) << 6 |
                    (ushort)(SUB161(auVar43 >> 0x3f,0) & 1) << 7 |
                    (ushort)(SUB161(auVar43 >> 0x47,0) & 1) << 8 |
                    (ushort)(SUB161(auVar43 >> 0x4f,0) & 1) << 9 |
                    (ushort)(SUB161(auVar43 >> 0x57,0) & 1) << 10 |
                    (ushort)(SUB161(auVar43 >> 0x5f,0) & 1) << 0xb |
                    (ushort)(SUB161(auVar43 >> 0x67,0) & 1) << 0xc |
                    (ushort)(SUB161(auVar43 >> 0x6f,0) & 1) << 0xd |
                    (ushort)(SUB161(auVar43 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar43[0xf] >> 7) << 0xf,
                    (ushort)(SUB161(auVar41 >> 7,0) & 1) |
                    (ushort)(SUB161(auVar41 >> 0xf,0) & 1) << 1 |
                    (ushort)(SUB161(auVar41 >> 0x17,0) & 1) << 2 |
                    (ushort)(SUB161(auVar41 >> 0x1f,0) & 1) << 3 |
                    (ushort)(SUB161(auVar41 >> 0x27,0) & 1) << 4 |
                    (ushort)(SUB161(auVar41 >> 0x2f,0) & 1) << 5 |
                    (ushort)(SUB161(auVar41 >> 0x37,0) & 1) << 6 |
                    (ushort)(SUB161(auVar41 >> 0x3f,0) & 1) << 7 |
                    (ushort)(SUB161(auVar41 >> 0x47,0) & 1) << 8 |
                    (ushort)(SUB161(auVar41 >> 0x4f,0) & 1) << 9 |
                    (ushort)(SUB161(auVar41 >> 0x57,0) & 1) << 10 |
                    (ushort)(SUB161(auVar41 >> 0x5f,0) & 1) << 0xb |
                    (ushort)(SUB161(auVar41 >> 0x67,0) & 1) << 0xc |
                    (ushort)(SUB161(auVar41 >> 0x6f,0) & 1) << 0xd |
                    (ushort)(SUB161(auVar41 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar41[0xf] >> 7) << 0xf);
  uVar39 = uVar39 - (uVar39 >> 1 & 0x55555555);
  uVar39 = (uVar39 >> 2 & 0x33333333) + (uVar39 & 0x33333333);
  return ((uint)(0x4332322132212110 >> ((byte)(iVar38 << 2) & 0x3f)) & 7) +
         (((uVar39 >> 4) + uVar39 & 0xf0f0f0f) * 0x1010101 >> 0x18) +
         (uint)(sf_ptrc_glValidateProgramARB == (_func_void_GLhandleARB *)0x0) + uVar37;
}

Assistant:

static sf::GlFunctionPointer glLoaderGetProcAddress(const char* name)
{
    return sf::Context::getFunction(name);
}